

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstructCondense<double>::Print(TPZDohrSubstructCondense<double> *this,ostream *out)

{
  TPZMatRed<double,_TPZFMatrix<double>_> *pTVar1;
  ostream *poVar2;
  TPZVec<int> *pTVar3;
  
  poVar2 = std::operator<<(out,
                           "void TPZDohrSubstructCondense<double>::Print(std::ostream &) const [TVar = double]"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(out,"fNEquations ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->fNEquations);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(out,"fNumInternalEquations ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->fNumInternalEquations);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(out,"fNumExternalEquations ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->fNumExternalEquations);
  std::endl<char,std::char_traits<char>>(poVar2);
  pTVar3 = GatherVec(this,Submesh,InternalFirst);
  poVar2 = std::operator<<(out,"Internal equations-first-Gather ");
  poVar2 = ::operator<<(poVar2,pTVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  pTVar3 = GatherVec(this,Submesh,ExternalFirst);
  poVar2 = std::operator<<(out,"External equations-first-Gather ");
  poVar2 = ::operator<<(poVar2,pTVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(out,"Numbering of the Coarse nodes in the global mesh fCoarseNodes ");
  poVar2 = ::operator<<(poVar2,&this->fCoarseNodes);
  std::endl<char,std::char_traits<char>>(poVar2);
  pTVar1 = ((this->fMatRedComplete).fRef)->fPointer;
  (*(pTVar1->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x1c])
            (pTVar1,"The matrix which computes phi and fKCi ",out,2);
  pTVar1 = ((this->fMatRed).fRef)->fPointer;
  (*(pTVar1->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x1c])
            (pTVar1,"The matrix with the internal nodes condensed ",out);
  TPZMatrix<double>::Print
            (&(this->fKCi).super_TPZMatrix<double>,"Coarse Matrix fKCi",out,EFormatted);
  TPZMatrix<double>::Print(&(this->fPhiC).super_TPZMatrix<double>,"fPhiC : ",out,EMathematicaInput);
  poVar2 = std::operator<<(out,"fWeights = ");
  poVar2 = ::operator<<(poVar2,&(this->fWeights).super_TPZVec<double>);
  std::endl<char,std::char_traits<char>>(poVar2);
  TPZMatrix<double>::Print
            (&(this->fPhiC_Weighted_Condensed).super_TPZMatrix<double>,"fPhiC_Weighted_Condensed",
             out,EFormatted);
  TPZMatrix<double>::Print(&(this->fLocalLoad).super_TPZMatrix<double>,"fLocalLoad ",out,EFormatted)
  ;
  TPZMatrix<double>::Print
            (&(this->fLocalWeightedResidual).super_TPZMatrix<double>,"fLocalWeightedResidual ",out,
             EFormatted);
  TPZMatrix<double>::Print
            (&(this->fAdjustSolution).super_TPZMatrix<double>,"fAdjustSolution",out,EFormatted);
  return;
}

Assistant:

void TPZDohrSubstructCondense<TVar>::Print(std::ostream &out) const
{
	out << __PRETTY_FUNCTION__ << std::endl;
	out << "fNEquations " << fNEquations << std::endl;
	out << "fNumInternalEquations " << fNumInternalEquations << std::endl;
	out << "fNumExternalEquations " << fNumExternalEquations << std::endl;
	const TPZVec<int> &internaleq = GatherVec(Submesh, InternalFirst);
	out << "Internal equations-first-Gather " << internaleq << std::endl;
	const TPZVec<int> &exteq = GatherVec(Submesh, ExternalFirst);
	out << "External equations-first-Gather " << exteq << std::endl;
	out << "Numbering of the Coarse nodes in the global mesh fCoarseNodes " << fCoarseNodes << std::endl;
	fMatRedComplete->Print("The matrix which computes phi and fKCi ",out,EMathematicaInput);
	fMatRed->Print("The matrix with the internal nodes condensed ", out,EMathematicaInput);
	fKCi.Print("Coarse Matrix fKCi",out);
	fPhiC.Print("fPhiC : ",out,EMathematicaInput);
	out << "fWeights = " << fWeights  << endl;
	fPhiC_Weighted_Condensed.Print("fPhiC_Weighted_Condensed", out);
	fLocalLoad.Print("fLocalLoad ", out);
	fLocalWeightedResidual.Print("fLocalWeightedResidual ", out);
	fAdjustSolution.Print("fAdjustSolution", out);
}